

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::generate_module_package_import
          (SystemVerilogCodeGen *this,Generator *generator)

{
  bool bVar1;
  char cVar2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  string_view __str;
  value_type *pkg_name;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *raw_import;
  Generator *generator_local;
  SystemVerilogCodeGen *this_local;
  
  this_00 = Generator::raw_package_imports_abi_cxx11_(generator);
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_00);
  if (!bVar1) {
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,cVar2);
    this->indent_ = this->indent_ + 1;
    __end1 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    pkg_name = (value_type *)
               std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&pkg_name), bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               ::operator*(&__end1);
      __str = indent(this);
      pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               &(this->stream_).super_stringstream.field_0x10,__str);
      poVar5 = std::operator<<(pbVar4,"import ");
      poVar5 = std::operator<<(poVar5,(string *)pvVar3);
      poVar5 = std::operator<<(poVar5,"::*;");
      cVar2 = Stream::endl(&this->stream_);
      std::operator<<(poVar5,cVar2);
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator++(&__end1);
    }
    this->indent_ = this->indent_ - 1;
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_module_package_import(Generator* generator) {
    auto const& raw_import = generator->raw_package_imports();
    if (raw_import.empty()) return;
    stream_ << stream_.endl();
    indent_++;
    for (auto const& pkg_name : raw_import) {
        stream_ << indent() << "import " << pkg_name << "::*;" << stream_.endl();
    }
    indent_--;
}